

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImDrawList::~ImDrawList(ImDrawList *this)

{
  void **ptr;
  ImVec4 *ptr_00;
  ImDrawChannel *ptr_01;
  ImVec2 *ptr_02;
  ImDrawVert *ptr_03;
  uint *ptr_04;
  ImDrawCmd *ptr_05;
  
  _ClearFreeMemory(this);
  ptr = (this->_TextureIdStack).Data;
  if (ptr != (void **)0x0) {
    ImGui::MemFree(ptr);
  }
  ptr_00 = (this->_ClipRectStack).Data;
  if (ptr_00 != (ImVec4 *)0x0) {
    ImGui::MemFree(ptr_00);
  }
  ImDrawListSplitter::ClearFreeMemory(&this->_Splitter);
  ptr_01 = (this->_Splitter)._Channels.Data;
  if (ptr_01 != (ImDrawChannel *)0x0) {
    ImGui::MemFree(ptr_01);
  }
  ptr_02 = (this->_Path).Data;
  if (ptr_02 != (ImVec2 *)0x0) {
    ImGui::MemFree(ptr_02);
  }
  ptr_03 = (this->VtxBuffer).Data;
  if (ptr_03 != (ImDrawVert *)0x0) {
    ImGui::MemFree(ptr_03);
  }
  ptr_04 = (this->IdxBuffer).Data;
  if (ptr_04 != (uint *)0x0) {
    ImGui::MemFree(ptr_04);
  }
  ptr_05 = (this->CmdBuffer).Data;
  if (ptr_05 != (ImDrawCmd *)0x0) {
    ImGui::MemFree(ptr_05);
  }
  return;
}

Assistant:

~ImDrawList() { _ClearFreeMemory(); }